

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t exr_attr_set_v2f(exr_context_t ctxt,int part_index,char *name,exr_attr_v2f_t *val)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  exr_result_t eVar2;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  char *pcVar3;
  exr_context_t nonc;
  char *pcVar4;
  exr_attribute_list_t *list;
  exr_attribute_t *attr;
  exr_attribute_t *local_38;
  
  if ((name != (char *)0x0) && (iVar1 = strcmp(name,"screenWindowCenter"), iVar1 == 0)) {
    iVar1 = exr_set_screen_window_center(ctxt,part_index,val);
    return iVar1;
  }
  local_38 = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar2 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar2;
  }
  if (ctxt->mode == '\x03') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar2 = 0x15;
LAB_00123e39:
    eVar2 = (*UNRECOVERED_JUMPTABLE)(ctxt,eVar2);
    return eVar2;
  }
  if (ctxt->mode == '\0') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar2 = 8;
    goto LAB_00123e39;
  }
  list = &ctxt->parts[(uint)part_index]->attributes;
  eVar2 = exr_attr_list_find_by_name(ctxt,list,name,&local_38);
  if (eVar2 == 0) {
    if (local_38->type != EXR_ATTR_V2F) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pcVar4 = local_38->type_name;
      pcVar3 = "\'%s\' requested type \'v2f\', but stored attributes is type \'%s\'";
      eVar2 = 0x10;
      goto LAB_00123f26;
    }
    if (val == (exr_attr_v2f_t *)0x0) goto LAB_00123f08;
  }
  else {
    if (eVar2 != 0xf) goto LAB_00123ed9;
    if ((ctxt->mode != '\x01') && (ctxt->mode != '\x04')) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return 0xf;
    }
    eVar2 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_V2F,0,(uint8_t **)0x0,&local_38);
    if (val == (exr_attr_v2f_t *)0x0) {
LAB_00123f08:
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pcVar3 = "No input value for setting \'%s\', type \'%s\'";
      pcVar4 = "v2f";
      eVar2 = 3;
LAB_00123f26:
      eVar2 = (*ctxt->print_error)(ctxt,eVar2,pcVar3,name,pcVar4);
      return eVar2;
    }
    if (eVar2 != 0) goto LAB_00123ed9;
  }
  ((local_38->field_6).box2f)->min = *val;
  eVar2 = 0;
LAB_00123ed9:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_set_v2f (
    exr_context_t         ctxt,
    int                   part_index,
    const char*           name,
    const exr_attr_v2f_t* val)
{
    if (name && 0 == strcmp (name, EXR_REQ_SCR_WC_STR))
        return exr_set_screen_window_center (ctxt, part_index, val);

    {
        ATTR_SET_IMPL_DEREF (EXR_ATTR_V2F, v2f);
    }
}